

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O1

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  timeval newer;
  char buf [256];
  char format [40];
  char local_168 [4];
  undefined1 auStack_164 [268];
  undefined1 local_58 [40];
  
  newer = tvnow();
  lVar2 = *(long *)((long)clientp + 0xb0);
  lVar8 = 0x7fffffffffffffff;
  if ((-1 < lVar2) &&
     (lVar8 = lVar2 + ultotal + dltotal, 0x7fffffffffffffff - lVar2 < ultotal + dltotal)) {
    lVar8 = 0x7fffffffffffffff;
  }
  lVar11 = 0x7fffffffffffffff;
  if ((-1 < lVar2) && (ulnow + dlnow <= 0x7fffffffffffffff - lVar2)) {
    lVar11 = lVar2 + ulnow + dlnow;
  }
  lVar2 = *(long *)((long)clientp + 0x10);
  if (*(int *)((long)clientp + 0x80) != 0) {
    if (lVar8 == 0) {
      lVar6 = tvdiff(newer,*(timeval *)((long)clientp + 0x90));
      if (lVar6 < 100) {
        return 0;
      }
      lVar6 = *(long *)((long)clientp + 0x88);
      iVar4 = *(int *)((long)clientp + 0xa0);
      iVar9 = 0;
      curl_msnprintf(local_168,0x100,"%*s\r",iVar4 + -1," ");
      iVar5 = *(int *)((long)clientp + 0xbc);
      auStack_164[iVar5] = 0x2d;
      builtin_strncpy(local_168 + iVar5,"-=O=",4);
      uVar1 = *(uint *)((long)clientp + 0xb8);
      uVar10 = 1000000 / (long)(iVar4 + -2) & 0xffffffff;
      local_168[(int)(sinus[uVar1 % 200] / uVar10)] = '#';
      local_168[(int)(sinus[uVar1 + ((uVar1 + 5) / 200) * -200 + 5] / uVar10)] = '#';
      local_168[(int)(sinus[uVar1 + ((uVar1 + 10) / 200) * -200 + 10] / uVar10)] = '#';
      local_168[(int)(sinus[uVar1 + ((uVar1 + 0xf) / 200) * -200 + 0xf] / uVar10)] = '#';
      fputs(local_168,*(FILE **)((long)clientp + 0xa8));
      uVar1 = *(int *)((long)clientp + 0xb8) + 2;
      uVar3 = *(int *)((long)clientp + 0xb8) - 0xc6;
      if (uVar1 < 200) {
        uVar3 = uVar1;
      }
      *(uint *)((long)clientp + 0xb8) = uVar3;
      if (lVar11 != lVar6) {
        iVar9 = *(int *)((long)clientp + 0xc0);
      }
      iVar9 = iVar9 + *(int *)((long)clientp + 0xbc);
      *(int *)((long)clientp + 0xbc) = iVar9;
      iVar4 = *(int *)((long)clientp + 0xa0) + -6;
      uVar7 = 0xffffffff;
      if (iVar9 < iVar4) {
        if (-1 < iVar9) goto LAB_0010b888;
        iVar4 = 0;
        uVar7 = 1;
      }
      *(undefined4 *)((long)clientp + 0xc0) = uVar7;
      *(int *)((long)clientp + 0xbc) = iVar4;
    }
    else {
      if (*(long *)((long)clientp + 0x88) == lVar11) {
        return 0;
      }
      lVar6 = tvdiff(newer,*(timeval *)((long)clientp + 0x90));
      if ((lVar6 < 100) && (lVar11 < lVar8)) {
        return 0;
      }
    }
  }
LAB_0010b888:
  *(int *)((long)clientp + 0x80) = *(int *)((long)clientp + 0x80) + 1;
  if ((0 < lVar8) && (lVar11 != *(long *)((long)clientp + 0x88))) {
    if (lVar8 < lVar11) {
      lVar8 = lVar11;
    }
    iVar9 = *(int *)((long)clientp + 0xa0) + -7;
    iVar5 = (int)((double)iVar9 * ((double)lVar11 / (double)lVar8));
    iVar4 = 0x100;
    if (iVar5 < 0x100) {
      iVar4 = iVar5;
    }
    memset(local_168,0x23,(long)iVar4);
    local_168[iVar4] = '\0';
    curl_msnprintf(local_58,0x28,"\r%%-%ds %%5.1f%%%%",iVar9);
    curl_mfprintf(((double)lVar11 / (double)lVar8) * 100.0,*(undefined8 *)((long)clientp + 0xa8),
                  local_58,local_168);
  }
  fflush(*(FILE **)((long)clientp + 0xa8));
  *(long *)((long)clientp + 0x88) = lVar11;
  *(timeval *)((long)clientp + 0x90) = newer;
  if (*(char *)(lVar2 + 0x2fa) == '\x01') {
    *(undefined1 *)(lVar2 + 0x2fa) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x18),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  struct timeval now = tvnow();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero
     when indicating that we are expecting to get the filesize from the
     remote */
  if(bar->initial_size < 0 ||
     ((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal)))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0 ||
     ((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow)))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress didn't change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we're at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    int num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}